

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int ws_dialer_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_setopt(ws_dialer_options,name,arg,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_http_client_set(*(nni_http_client **)((long)arg + 0x50),name,buf,sz,t);
    if (iVar1 == 9) {
      iVar1 = strncmp(name,"ws:header:",10);
      if (iVar1 == 0) {
        iVar1 = ws_check_string(buf,sz,t);
        if (iVar1 == 0) {
          nni_mtx_lock((nni_mtx *)((long)arg + 0x58));
          iVar1 = ws_set_header((nni_list *)((long)arg + 0xe8),name + 10,(char *)buf);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
        }
      }
      else {
        iVar1 = 9;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
ws_dialer_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	nni_ws_dialer *d = arg;
	int            rv;

	rv = nni_setopt(ws_dialer_options, name, d, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_http_client_set(d->client, name, buf, sz, t);
	}

	if (rv == NNG_ENOTSUP) {
		if (startswith(name, NNG_OPT_WS_HEADER)) {
			rv = ws_dialer_set_header(d, name, buf, sz, t);
		}
	}
	return (rv);
}